

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O0

array<float,_4UL> reverse<std::array<float,4ul>>(array<float,_4UL> *container)

{
  value_type_conflict2 vVar1;
  value_type_conflict2 vVar2;
  size_type sVar3;
  reference pvVar4;
  array<float,_4UL> aVar5;
  int local_3c;
  value_type_conflict2 t;
  int i;
  size_type sz;
  array<float,_4UL> c;
  array<float,_4UL> *container_local;
  
  sz = *(size_type *)container->_M_elems;
  c._M_elems._0_8_ = *(undefined8 *)(container->_M_elems + 2);
  c._M_elems._8_8_ = container;
  sVar3 = std::array<float,_4UL>::size((array<float,_4UL> *)&sz);
  for (local_3c = 0; (ulong)(long)local_3c < sVar3 >> 1; local_3c = local_3c + 1) {
    pvVar4 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)&sz,(long)local_3c);
    vVar1 = *pvVar4;
    pvVar4 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)&sz,(sVar3 - (long)local_3c) - 1);
    vVar2 = *pvVar4;
    pvVar4 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)&sz,(long)local_3c);
    *pvVar4 = vVar2;
    pvVar4 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)&sz,(sVar3 - (long)local_3c) - 1);
    *pvVar4 = vVar1;
  }
  aVar5._M_elems[0] = (float)(undefined4)sz;
  aVar5._M_elems[1] = (float)sz._4_4_;
  aVar5._M_elems[2] = c._M_elems[0];
  aVar5._M_elems[3] = c._M_elems[1];
  return (array<float,_4UL>)aVar5._M_elems;
}

Assistant:

auto reverse(const Container& container)
{
    auto c = container;
    auto sz = c.size();
    for(auto i=0; i<sz/2; ++i)
    {
        auto t = c[i];
        c[i] = c[sz-i-1];
        c[sz-i-1] = t;
    }
    return c;
}